

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O0

string * __thiscall
Physical::getDescription_abi_cxx11_(string *__return_storage_ptr__,Physical *this)

{
  long lVar1;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  Physical *local_18;
  Physical *this_local;
  
  local_18 = this;
  this_local = (Physical *)__return_storage_ptr__;
  Unit::getName_abi_cxx11_(&local_38,&this->physicalUnit);
  lVar1 = std::__cxx11::string::length();
  std::__cxx11::string::~string((string *)&local_38);
  if (lVar1 == 0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&this->physicalDescription);
  }
  else {
    std::operator+(&local_78,&this->physicalDescription," (");
    Unit::getSymbol_abi_cxx11_(&local_98,&this->physicalUnit);
    std::operator+(&local_58,&local_78,&local_98);
    std::operator+(__return_storage_ptr__,&local_58,")");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

string Physical::getDescription()
{
	if (physicalUnit.getName().length())
        return physicalDescription + " (" + physicalUnit.getSymbol() + ")";
	else return physicalDescription;
}